

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O1

int s2_semi_mgau_frame_eval
              (s2_semi_mgau_t *s,ascr_t *ascr,fast_gmm_t *fgmm,mfcc_t **featbuf,int32 frame)

{
  ulong uVar1;
  byte bVar2;
  ushort uVar3;
  short sVar4;
  short sVar5;
  mfcc_t *feat;
  vqFeature_t *pvVar6;
  vqFeature_t vVar7;
  vqFeature_t *pvVar8;
  int32 *piVar9;
  uint8 *puVar10;
  uint8 **ppuVar11;
  uint8 *puVar12;
  uint8 *puVar13;
  uint8 *puVar14;
  uint8 *puVar15;
  uint8 *puVar16;
  uint8 *puVar17;
  void *pvVar18;
  mfcc_t *pmVar19;
  bool bVar20;
  vqFeature_t *pvVar21;
  long lVar22;
  kd_tree_node_t *pkVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  long lVar32;
  mfcc_t *pmVar33;
  ulong uVar34;
  mfcc_t *pmVar35;
  int iVar36;
  uint uVar37;
  mfcc_t *pmVar38;
  mfcc_t mVar39;
  float fVar40;
  
  memset(ascr->senscr,0,(long)s->n_sen << 2);
  iVar25 = frame % s->n_topn_hist;
  lVar24 = (long)iVar25;
  s->f = s->topn_hist[lVar24];
  if (0 < s->n_feat) {
    lVar29 = 0;
    do {
      if (s->frame_idx <= frame) {
        lVar22 = lVar24;
        if (iVar25 == 0) {
          lVar22 = (long)s->n_topn_hist;
        }
        memcpy(s->f[lVar29],s->topn_hist[lVar22 + -1][lVar29],(long)s->max_topn << 3);
        feat = featbuf[lVar29];
        if (0 < s->max_topn) {
          pvVar6 = s->f[lVar29];
          iVar36 = s->veclen[lVar29];
          uVar27 = 0;
          do {
            mVar39 = s->dets[lVar29][pvVar6[uVar27].codeword];
            if (0 < iVar36) {
              lVar22 = (long)(iVar36 * pvVar6[uVar27].codeword);
              lVar32 = 0;
              do {
                fVar40 = (float)feat[lVar32] - (float)s->means[lVar29][lVar22 + lVar32];
                mVar39 = (mfcc_t)((float)mVar39 -
                                 fVar40 * fVar40 * (float)s->vars[lVar29][lVar22 + lVar32]);
                lVar32 = lVar32 + 1;
              } while (iVar36 != (int)lVar32);
            }
            pvVar6[uVar27].score = (int)(float)mVar39;
            if (uVar27 != 0) {
              vVar7 = pvVar6[uVar27];
              uVar28 = uVar27;
              do {
                uVar34 = uVar28 - 1 & 0xffffffff;
                if ((int)(float)mVar39 <= pvVar6[uVar34].score) goto LAB_00119f03;
                pvVar6[uVar28] = pvVar6[uVar34];
                bVar20 = 1 < (long)uVar28;
                uVar28 = uVar28 - 1;
              } while (bVar20);
              uVar28 = 0;
LAB_00119f03:
              pvVar6[(int)uVar28] = vVar7;
            }
            uVar27 = uVar27 + 1;
          } while ((long)uVar27 < (long)s->max_topn);
        }
        if (frame % (int)s->ds_ratio == 0) {
          if (s->kdtrees == (kd_tree_t **)0x0) {
            sVar4 = s->n_density;
            if (0 < (long)sVar4) {
              pvVar8 = s->f[lVar29];
              sVar5 = s->max_topn;
              pmVar19 = s->dets[lVar29];
              iVar36 = s->veclen[lVar29];
              pmVar33 = s->vars[lVar29];
              pmVar35 = s->means[lVar29];
              pvVar6 = pvVar8 + (long)sVar5 + -2;
              pmVar38 = pmVar19;
              do {
                mVar39 = *pmVar38;
                if (0 < iVar36) {
                  lVar22 = 0;
                  lVar32 = 0;
                  do {
                    if ((float)mVar39 < (float)pvVar8[(long)sVar5 + -1].score) {
                      pmVar35 = (mfcc_t *)((long)pmVar35 + ((iVar36 - lVar32) * 4 - lVar22));
                      pmVar33 = (mfcc_t *)((long)pmVar33 + ((iVar36 - lVar32) * 4 - lVar22));
                      goto LAB_0011a825;
                    }
                    mVar39 = (mfcc_t)((float)mVar39 -
                                     ((float)feat[lVar32] - (float)pmVar35[lVar32]) *
                                     ((float)feat[lVar32] - (float)pmVar35[lVar32]) *
                                     (float)pmVar33[lVar32]);
                    lVar32 = lVar32 + 1;
                    lVar22 = lVar22 + -4;
                  } while (iVar36 != (int)lVar32);
                  pmVar35 = (mfcc_t *)((long)pmVar35 - lVar22);
                  pmVar33 = (mfcc_t *)((long)pmVar33 - lVar22);
                }
                iVar30 = (int)(float)mVar39;
                if (pvVar8[(long)sVar5 + -1].score <= iVar30) {
                  uVar27 = (ulong)s->max_topn;
                  iVar26 = (int)((ulong)((long)pmVar38 - (long)pmVar19) >> 2);
                  pvVar21 = pvVar6;
                  if ((long)uVar27 < 1) {
joined_r0x0011a7fa:
                    for (; (pvVar8 <= pvVar21 && (pvVar21->score <= iVar30)); pvVar21 = pvVar21 + -1
                        ) {
                      pvVar21[1] = *pvVar21;
                    }
                    pvVar21[1].codeword = iVar26;
                    pvVar21[1].score = iVar30;
                  }
                  else if (pvVar8->codeword != iVar26) {
                    uVar28 = 0;
                    do {
                      if (uVar27 - 1 == uVar28) goto joined_r0x0011a7fa;
                      uVar34 = uVar28 + 1;
                      lVar22 = uVar28 + 1;
                      uVar28 = uVar34;
                    } while (pvVar8[lVar22].codeword != iVar26);
                    if (uVar27 <= uVar34) goto joined_r0x0011a7fa;
                  }
                }
LAB_0011a825:
                pmVar38 = pmVar38 + 1;
              } while (pmVar38 < pmVar19 + sVar4);
            }
          }
          else {
            pkVar23 = eval_kd_tree(s->kdtrees[lVar29],feat,s->kd_maxdepth);
            uVar37 = s->kd_maxbbi;
            uVar3 = pkVar23->n_bbi;
            uVar31 = (uint)uVar3;
            if ((int)uVar37 < (int)(uint)uVar3) {
              uVar31 = uVar37;
            }
            if (uVar37 == 0xffffffff) {
              uVar31 = (uint)uVar3;
            }
            if (uVar31 != 0) {
              pvVar8 = s->f[lVar29];
              sVar4 = s->max_topn;
              iVar36 = s->veclen[lVar29];
              pvVar6 = pvVar8 + (long)sVar4 + -2;
              uVar27 = 0;
              do {
                mVar39 = s->dets[lVar29][pkVar23->bbi[uVar27]];
                uVar37 = (uint)pkVar23->bbi[uVar27];
                if (0 < iVar36) {
                  lVar22 = 0;
                  do {
                    if ((float)mVar39 < (float)pvVar8[(long)sVar4 + -1].score) goto LAB_0011a0d6;
                    fVar40 = (float)feat[lVar22] -
                             (float)s->means[lVar29][(ulong)(iVar36 * uVar37) + lVar22];
                    mVar39 = (mfcc_t)((float)mVar39 -
                                     fVar40 * fVar40 *
                                     (float)s->vars[lVar29][(ulong)(iVar36 * uVar37) + lVar22]);
                    lVar22 = lVar22 + 1;
                  } while (iVar36 != (int)lVar22);
                }
                iVar30 = (int)(float)mVar39;
                if (pvVar8[(long)sVar4 + -1].score <= iVar30) {
                  uVar28 = (ulong)s->max_topn;
                  pvVar21 = pvVar6;
                  if ((long)uVar28 < 1) {
joined_r0x0011a0b3:
                    for (; (pvVar8 <= pvVar21 && (pvVar21->score <= iVar30)); pvVar21 = pvVar21 + -1
                        ) {
                      pvVar21[1] = *pvVar21;
                    }
                    pvVar21[1].codeword = uVar37;
                    pvVar21[1].score = iVar30;
                  }
                  else if (pvVar8->codeword != uVar37) {
                    uVar34 = 0;
                    do {
                      if (uVar28 - 1 == uVar34) goto joined_r0x0011a0b3;
                      uVar1 = uVar34 + 1;
                      lVar22 = uVar34 + 1;
                      uVar34 = uVar1;
                    } while (pvVar8[lVar22].codeword != uVar37);
                    if (uVar28 <= uVar1) goto joined_r0x0011a0b3;
                  }
                }
LAB_0011a0d6:
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar31);
            }
          }
        }
        if (s->max_topn < 1) {
          lVar22 = 0;
        }
        else {
          pvVar6 = s->f[lVar29];
          iVar36 = pvVar6->score;
          lVar22 = 0;
          do {
            iVar30 = (iVar36 >> 10) - (pvVar6[lVar22].score >> 10);
            if (0x5f < iVar30) {
              iVar30 = 0x60;
            }
            pvVar6[lVar22].score = iVar30;
          } while (((s->topn_beam[lVar29] == 0) || (iVar30 <= (int)(uint)s->topn_beam[lVar29])) &&
                  (lVar22 = lVar22 + 1, lVar22 < s->max_topn));
        }
        s->topn_hist_n[lVar24][lVar29] = (uint8)lVar22;
      }
      bVar2 = s->topn_hist_n[lVar24][lVar29];
      piVar9 = ascr->senscr;
      puVar10 = ascr->sen_active;
      switch(bVar2) {
      case 1:
        if (0 < s->n_sen) {
          pvVar6 = s->f[lVar29];
          puVar12 = s->mixw[lVar29][pvVar6->codeword];
          lVar22 = 0;
          do {
            if (puVar10[lVar22] != '\0') {
              piVar9[lVar22] = piVar9[lVar22] + ((uint)puVar12[lVar22] + pvVar6->score) * -0x400;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < s->n_sen);
        }
        break;
      case 2:
        if (0 < s->n_sen) {
          pvVar6 = s->f[lVar29];
          puVar12 = s->mixw[lVar29][pvVar6->codeword];
          puVar13 = s->mixw[lVar29][pvVar6[1].codeword];
          lVar22 = 0;
          do {
            if (puVar10[lVar22] != '\0') {
              iVar30 = (uint)puVar12[lVar22] + pvVar6->score;
              iVar36 = (uint)puVar13[lVar22] + pvVar6[1].score;
              uVar37 = iVar30 - iVar36;
              if (iVar30 < iVar36) {
                iVar36 = iVar30;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              piVar9[lVar22] =
                   piVar9[lVar22] +
                   ((uint)*(byte *)((long)(s->lmath_8b->t).table + (ulong)uVar31) - iVar36) * 0x400;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < s->n_sen);
        }
        break;
      case 3:
        if (0 < s->n_sen) {
          ppuVar11 = s->mixw[lVar29];
          pvVar6 = s->f[lVar29];
          puVar12 = ppuVar11[pvVar6->codeword];
          puVar13 = ppuVar11[pvVar6[1].codeword];
          puVar14 = ppuVar11[pvVar6[2].codeword];
          lVar22 = 0;
          do {
            if (puVar10[lVar22] != '\0') {
              iVar30 = (uint)puVar12[lVar22] + pvVar6->score;
              iVar36 = (uint)puVar13[lVar22] + pvVar6[1].score;
              uVar37 = iVar30 - iVar36;
              if (iVar30 < iVar36) {
                iVar36 = iVar30;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              pvVar18 = (s->lmath_8b->t).table;
              iVar36 = iVar36 - (uint)*(byte *)((long)pvVar18 + (ulong)uVar31);
              iVar30 = (uint)puVar14[lVar22] + pvVar6[2].score;
              uVar37 = iVar36 - iVar30;
              if (iVar36 < iVar30) {
                iVar30 = iVar36;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              piVar9[lVar22] =
                   piVar9[lVar22] +
                   ((uint)*(byte *)((long)pvVar18 + (ulong)uVar31) - iVar30) * 0x400;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < s->n_sen);
        }
        break;
      case 4:
        if (0 < s->n_sen) {
          ppuVar11 = s->mixw[lVar29];
          pvVar6 = s->f[lVar29];
          puVar12 = ppuVar11[pvVar6->codeword];
          puVar13 = ppuVar11[pvVar6[1].codeword];
          puVar14 = ppuVar11[pvVar6[2].codeword];
          puVar15 = ppuVar11[pvVar6[3].codeword];
          lVar22 = 0;
          do {
            if (puVar10[lVar22] != '\0') {
              iVar30 = (uint)puVar12[lVar22] + pvVar6->score;
              iVar36 = (uint)puVar13[lVar22] + pvVar6[1].score;
              uVar37 = iVar30 - iVar36;
              if (iVar30 < iVar36) {
                iVar36 = iVar30;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              pvVar18 = (s->lmath_8b->t).table;
              iVar36 = iVar36 - (uint)*(byte *)((long)pvVar18 + (ulong)uVar31);
              iVar30 = (uint)puVar14[lVar22] + pvVar6[2].score;
              uVar37 = iVar36 - iVar30;
              if (iVar36 < iVar30) {
                iVar30 = iVar36;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              iVar30 = iVar30 - (uint)*(byte *)((long)pvVar18 + (ulong)uVar31);
              iVar36 = (uint)puVar15[lVar22] + pvVar6[3].score;
              uVar37 = iVar30 - iVar36;
              if (iVar30 < iVar36) {
                iVar36 = iVar30;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              piVar9[lVar22] =
                   piVar9[lVar22] +
                   ((uint)*(byte *)((long)pvVar18 + (ulong)uVar31) - iVar36) * 0x400;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < s->n_sen);
        }
        break;
      case 5:
        if (0 < s->n_sen) {
          ppuVar11 = s->mixw[lVar29];
          pvVar6 = s->f[lVar29];
          puVar12 = ppuVar11[pvVar6->codeword];
          puVar13 = ppuVar11[pvVar6[1].codeword];
          puVar14 = ppuVar11[pvVar6[2].codeword];
          puVar15 = ppuVar11[pvVar6[3].codeword];
          puVar16 = ppuVar11[pvVar6[4].codeword];
          lVar22 = 0;
          do {
            if (puVar10[lVar22] != '\0') {
              iVar30 = (uint)puVar12[lVar22] + pvVar6->score;
              iVar36 = (uint)puVar13[lVar22] + pvVar6[1].score;
              uVar37 = iVar30 - iVar36;
              if (iVar30 < iVar36) {
                iVar36 = iVar30;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              pvVar18 = (s->lmath_8b->t).table;
              iVar36 = iVar36 - (uint)*(byte *)((long)pvVar18 + (ulong)uVar31);
              iVar30 = (uint)puVar14[lVar22] + pvVar6[2].score;
              uVar37 = iVar36 - iVar30;
              if (iVar36 < iVar30) {
                iVar30 = iVar36;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              iVar30 = iVar30 - (uint)*(byte *)((long)pvVar18 + (ulong)uVar31);
              iVar36 = (uint)puVar15[lVar22] + pvVar6[3].score;
              uVar37 = iVar30 - iVar36;
              if (iVar30 < iVar36) {
                iVar36 = iVar30;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              iVar36 = iVar36 - (uint)*(byte *)((long)pvVar18 + (ulong)uVar31);
              iVar30 = (uint)puVar16[lVar22] + pvVar6[4].score;
              uVar37 = iVar36 - iVar30;
              if (iVar36 < iVar30) {
                iVar30 = iVar36;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              piVar9[lVar22] =
                   piVar9[lVar22] +
                   ((uint)*(byte *)((long)pvVar18 + (ulong)uVar31) - iVar30) * 0x400;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < s->n_sen);
        }
        break;
      case 6:
        if (0 < s->n_sen) {
          ppuVar11 = s->mixw[lVar29];
          pvVar6 = s->f[lVar29];
          puVar12 = ppuVar11[pvVar6->codeword];
          puVar13 = ppuVar11[pvVar6[1].codeword];
          puVar14 = ppuVar11[pvVar6[2].codeword];
          puVar15 = ppuVar11[pvVar6[3].codeword];
          puVar16 = ppuVar11[pvVar6[4].codeword];
          puVar17 = ppuVar11[pvVar6[5].codeword];
          lVar22 = 0;
          do {
            if (puVar10[lVar22] != '\0') {
              iVar30 = (uint)puVar12[lVar22] + pvVar6->score;
              iVar36 = (uint)puVar13[lVar22] + pvVar6[1].score;
              uVar37 = iVar30 - iVar36;
              if (iVar30 < iVar36) {
                iVar36 = iVar30;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              pvVar18 = (s->lmath_8b->t).table;
              iVar36 = iVar36 - (uint)*(byte *)((long)pvVar18 + (ulong)uVar31);
              iVar30 = (uint)puVar14[lVar22] + pvVar6[2].score;
              uVar37 = iVar36 - iVar30;
              if (iVar36 < iVar30) {
                iVar30 = iVar36;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              iVar30 = iVar30 - (uint)*(byte *)((long)pvVar18 + (ulong)uVar31);
              iVar36 = (uint)puVar15[lVar22] + pvVar6[3].score;
              uVar37 = iVar30 - iVar36;
              if (iVar30 < iVar36) {
                iVar36 = iVar30;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              iVar36 = iVar36 - (uint)*(byte *)((long)pvVar18 + (ulong)uVar31);
              iVar30 = (uint)puVar16[lVar22] + pvVar6[4].score;
              uVar37 = iVar36 - iVar30;
              if (iVar36 < iVar30) {
                iVar30 = iVar36;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              iVar30 = iVar30 - (uint)*(byte *)((long)pvVar18 + (ulong)uVar31);
              iVar36 = (uint)puVar17[lVar22] + pvVar6[5].score;
              uVar37 = iVar30 - iVar36;
              if (iVar30 < iVar36) {
                iVar36 = iVar30;
              }
              uVar31 = -uVar37;
              if (0 < (int)uVar37) {
                uVar31 = uVar37;
              }
              piVar9[lVar22] =
                   piVar9[lVar22] +
                   ((uint)*(byte *)((long)pvVar18 + (ulong)uVar31) - iVar36) * 0x400;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < s->n_sen);
        }
        break;
      default:
        if (0 < s->n_sen) {
          lVar22 = 0;
          do {
            if (puVar10[lVar22] != '\0') {
              pvVar6 = s->f[lVar29];
              iVar36 = (uint)s->mixw[lVar29][pvVar6->codeword][lVar22] + pvVar6->score;
              if (1 < bVar2) {
                lVar32 = 0;
                do {
                  iVar30 = (uint)s->mixw[lVar29][pvVar6[lVar32 + 1].codeword][lVar22] +
                           pvVar6[lVar32 + 1].score;
                  uVar37 = iVar36 - iVar30;
                  if (iVar36 < iVar30) {
                    iVar30 = iVar36;
                  }
                  uVar31 = -uVar37;
                  if (0 < (int)uVar37) {
                    uVar31 = uVar37;
                  }
                  iVar36 = iVar30 - (uint)*(byte *)((long)(s->lmath_8b->t).table + (ulong)uVar31);
                  lVar32 = lVar32 + 1;
                } while ((ulong)bVar2 - 1 != lVar32);
              }
              piVar9[lVar22] = piVar9[lVar22] + iVar36 * -0x400;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < s->n_sen);
        }
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < s->n_feat);
  }
  return 0;
}

Assistant:

int
s2_semi_mgau_frame_eval(s2_semi_mgau_t *s,
                        ascr_t *ascr,
                        fast_gmm_t *fgmm,
                        mfcc_t **featbuf,
                        int32 frame)
{
    int i, topn_idx;

    memset(ascr->senscr, 0, s->n_sen * sizeof(*ascr->senscr));
    /* No bounds checking is done here, which just means you'll get
     * semi-random crap if you request a frame in the future or one
     * that's too far in the past. */
    topn_idx = frame % s->n_topn_hist;
    s->f = s->topn_hist[topn_idx];
    for (i = 0; i < s->n_feat; ++i) {
        /* For past frames this will already be computed. */
        if (frame >= s->frame_idx) {
            vqFeature_t **lastf;
            if (topn_idx == 0)
                lastf = s->topn_hist[s->n_topn_hist-1];
            else
                lastf = s->topn_hist[topn_idx-1];
            memcpy(s->f[i], lastf[i], sizeof(vqFeature_t) * s->max_topn);
            mgau_dist(s, frame, i, featbuf[i]);
            s->topn_hist_n[topn_idx][i] = mgau_norm(s, i);
        }
        get_scores_8b_feat(s, i, s->topn_hist_n[topn_idx][i],
                           ascr->senscr, ascr->sen_active);
    }

    return 0;
}